

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O0

uint16_t __thiscall level_tools::get_sector_idx(level_tools *this,fvector3 *p)

{
  vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_> *this_00;
  bool bVar1;
  reference ppsVar2;
  const_reference ppxVar3;
  fbox *this_01;
  difference_type dVar4;
  float fVar5;
  fbox *aabb;
  sector_data_vec_cit end;
  sector_data_vec_cit it;
  sector_data_vec_cit it0;
  float min_size;
  float size;
  uint16_t sector_idx;
  fvector3 *p_local;
  level_tools *this_local;
  
  min_size._2_2_ = 0xffff;
  it0._M_current._4_4_ = std::numeric_limits<float>::max();
  end._M_current =
       (sector_data **)
       std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::begin
                 (this->m_sectors);
  it._M_current = end._M_current;
  aabb = (fbox *)std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::end
                           (this->m_sectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::sector_data_*const_*,_std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>_>
                                  *)&aabb), bVar1) {
    this_00 = this->m_subdivisions;
    ppsVar2 = __gnu_cxx::
              __normal_iterator<xray_re::sector_data_*const_*,_std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>_>
              ::operator*(&end);
    ppxVar3 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                        (this_00,(ulong)(*ppsVar2)->root);
    this_01 = xray_re::xr_ogf::bbox(*ppxVar3);
    bVar1 = xray_re::_aabb<float>::contain(this_01,p);
    if ((bVar1) && (fVar5 = xray_re::_aabb<float>::size(this_01), fVar5 < it0._M_current._4_4_)) {
      dVar4 = __gnu_cxx::operator-(&end,&it);
      min_size._2_2_ = (uint16_t)dVar4;
      it0._M_current._4_4_ = fVar5;
    }
    __gnu_cxx::
    __normal_iterator<xray_re::sector_data_*const_*,_std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>_>
    ::operator++(&end);
  }
  if (min_size._2_2_ == 0xffff) {
    __assert_fail("sector_idx != (65535)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sectors.cxx"
                  ,0x59,"uint16_t level_tools::get_sector_idx(const fvector3 &) const");
  }
  return min_size._2_2_;
}

Assistant:

uint16_t level_tools::get_sector_idx(const fvector3& p) const
{
	uint16_t sector_idx = UINT16_MAX;
	float size, min_size = xr_numeric_limits<float>::max();
	for (sector_data_vec_cit it0 = m_sectors->begin(), it = it0, end = m_sectors->end();
			it != end; ++it) {
		const fbox& aabb = m_subdivisions->at((*it)->root)->bbox();
		if (aabb.contain(p) && min_size > (size = aabb.size())) {
			min_size = size;
			sector_idx = uint16_t((it - it0) & UINT16_MAX);
		}
	}
	xr_assert(sector_idx != UINT16_MAX);
	return sector_idx;
}